

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O3

int Wlc_ObjHasArithm_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar3;
  
  do {
    uVar2 = *(ushort *)pObj & 0x3f;
    if (0x2d < uVar2) {
LAB_0037ebf4:
      return (uint)((short)uVar2 == 0x32);
    }
    if ((0x3008080UL >> uVar2 & 1) == 0) {
      if ((0x380000000000U >> uVar2 & 1) != 0) {
        return 1;
      }
      if (uVar2 == 6) {
        return 0;
      }
      goto LAB_0037ebf4;
    }
    paVar3 = &pObj->field_10;
    if (((short)uVar2 == 0x16) || (2 < pObj->nFanins)) {
      paVar3 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar3->pFanins[0];
    }
    iVar1 = paVar3->Fanins[0];
    if (((long)iVar1 < 1) || (p->nObjsAlloc <= iVar1)) {
      __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                    ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
    }
    pObj = p->pObjs + iVar1;
  } while( true );
}

Assistant:

int Wlc_ObjHasArithm_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    if ( pObj->Type == WLC_OBJ_CONST )
        return 0;
    if ( pObj->Type == WLC_OBJ_BUF         || pObj->Type == WLC_OBJ_BIT_NOT ||
         pObj->Type == WLC_OBJ_BIT_ZEROPAD || pObj->Type == WLC_OBJ_BIT_SIGNEXT )
         return Wlc_ObjHasArithm_rec( p, Wlc_ObjFanin0(p, pObj) );
    return pObj->Type == WLC_OBJ_ARI_ADD   || pObj->Type == WLC_OBJ_ARI_SUB || 
           pObj->Type == WLC_OBJ_ARI_MULTI || pObj->Type == WLC_OBJ_ARI_MINUS;
}